

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry **ppRVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  RowSetEntry *pRVar5;
  RowSetEntry *pRVar6;
  RowSetEntry *pRVar7;
  RowSetEntry **ppRVar8;
  RowSetEntry *pRVar9;
  RowSetEntry head;
  RowSetEntry *aBucket [40];
  RowSetEntry local_170;
  RowSetEntry *local_158 [40];
  
  memset(local_158,0,0x140);
  pRVar7 = (RowSetEntry *)0x0;
  if (pIn != (RowSetEntry *)0x0) {
    pRVar7 = (RowSetEntry *)0x0;
    do {
      pRVar5 = pIn->pRight;
      pIn->pRight = (RowSetEntry *)0x0;
      ppRVar8 = local_158;
      if (pRVar7 != (RowSetEntry *)0x0) {
        uVar4 = 0;
        pRVar6 = &local_170;
LAB_00155522:
        do {
          lVar3 = pRVar7->v;
          do {
            if (lVar3 <= pIn->v) {
              if (lVar3 < pIn->v) {
                pRVar6->pRight = pRVar7;
                pRVar6 = pRVar7;
              }
              pRVar7 = pRVar7->pRight;
              pRVar9 = pIn;
              if (pRVar7 != (RowSetEntry *)0x0) goto LAB_00155522;
              break;
            }
            pRVar6->pRight = pIn;
            ppRVar1 = &pIn->pRight;
            pRVar6 = pIn;
            pIn = *ppRVar1;
            pRVar9 = pRVar7;
          } while (*ppRVar1 != (RowSetEntry *)0x0);
          pRVar6->pRight = pRVar9;
          *ppRVar8 = (RowSetEntry *)0x0;
          uVar4 = (ulong)((int)uVar4 + 1);
          ppRVar8 = local_158 + uVar4;
          pRVar7 = *ppRVar8;
          pRVar6 = &local_170;
          pIn = local_170.pRight;
        } while (pRVar7 != (RowSetEntry *)0x0);
      }
      *ppRVar8 = pIn;
      pRVar7 = local_158[0];
      pIn = pRVar5;
    } while (pRVar5 != (RowSetEntry *)0x0);
  }
  lVar3 = 1;
  do {
    pRVar5 = local_158[lVar3];
    pRVar6 = pRVar7;
    if ((pRVar5 != (RowSetEntry *)0x0) &&
       (pRVar6 = pRVar5, pRVar9 = &local_170, pRVar7 != (RowSetEntry *)0x0)) {
      do {
        lVar2 = pRVar7->v;
        while (pRVar5->v < lVar2) {
          pRVar9->pRight = pRVar5;
          ppRVar8 = &pRVar5->pRight;
          pRVar6 = pRVar7;
          pRVar9 = pRVar5;
          pRVar5 = *ppRVar8;
          if (*ppRVar8 == (RowSetEntry *)0x0) goto LAB_001555ed;
        }
        if (lVar2 < pRVar5->v) {
          pRVar9->pRight = pRVar7;
          pRVar9 = pRVar7;
        }
        pRVar7 = pRVar7->pRight;
        pRVar6 = pRVar5;
      } while (pRVar7 != (RowSetEntry *)0x0);
LAB_001555ed:
      pRVar9->pRight = pRVar6;
      pRVar6 = local_170.pRight;
    }
    lVar3 = lVar3 + 1;
    pRVar7 = pRVar6;
    if (lVar3 == 0x28) {
      return pRVar6;
    }
  } while( true );
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = aBucket[0];
  for(i=1; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    if( aBucket[i]==0 ) continue;
    pIn = pIn ? rowSetEntryMerge(pIn, aBucket[i]) : aBucket[i];
  }
  return pIn;
}